

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

bool __thiscall ON_ScaleValue::Read(ON_ScaleValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  LengthUnitSystem LVar2;
  AngleUnitSystem AVar3;
  ScaleStringFormat SVar4;
  uint local_2c;
  byte local_25;
  uint u;
  bool rc;
  ON_BinaryArchive *pOStack_20;
  int content_version;
  ON_BinaryArchive *archive_local;
  ON_ScaleValue *this_local;
  
  pOStack_20 = archive;
  archive_local = (ON_BinaryArchive *)this;
  operator=(this,&Unset);
  u = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(pOStack_20,(int *)&u);
  if (!bVar1) {
    return false;
  }
  local_25 = 0;
  bVar1 = ON_BinaryArchive::ReadDouble(pOStack_20,&this->m_left_to_right_scale);
  if (((bVar1) &&
      (bVar1 = ON_BinaryArchive::ReadDouble(pOStack_20,&this->m_right_to_left_scale), bVar1)) &&
     (bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&this->m_context_locale_id), bVar1)) {
    local_2c = (uint)this->m_context_length_unit_system;
    bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&local_2c);
    if (bVar1) {
      LVar2 = ON::LengthUnitSystemFromUnsigned(local_2c);
      this->m_context_length_unit_system = LVar2;
      local_2c = (uint)this->m_context_angle_unit_system;
      bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&local_2c);
      if (bVar1) {
        AVar3 = ON::AngleUnitSystemFromUnsigned(local_2c);
        this->m_context_angle_unit_system = AVar3;
        bVar1 = ON_BinaryArchive::ReadString(pOStack_20,&this->m_scale_as_string);
        if (((bVar1) && (bVar1 = ON_LengthValue::Read(&this->m_left_length,pOStack_20), bVar1)) &&
           (bVar1 = ON_LengthValue::Read(&this->m_right_length,pOStack_20), bVar1)) {
          if (0 < (int)u) {
            local_2c = (uint)this->m_string_format_preference;
            bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&local_2c);
            if (!bVar1) goto LAB_00861bfb;
            SVar4 = ScaleStringFormatFromUnsigned(local_2c);
            this->m_string_format_preference = SVar4;
          }
          local_25 = 1;
        }
      }
    }
  }
LAB_00861bfb:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_20);
  if (!bVar1) {
    local_25 = 0;
  }
  return (bool)(local_25 & 1);
}

Assistant:

bool ON_ScaleValue::Read(
  class ON_BinaryArchive& archive
)
{
  *this = ON_ScaleValue::Unset;

  int content_version = 0;
  if (!archive.BeginRead3dmAnonymousChunk(&content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!archive.ReadDouble(&m_left_to_right_scale))
      break;
    if (!archive.ReadDouble(&m_right_to_left_scale))
      break;
    if (!archive.ReadInt(&m_context_locale_id))
      break;

    unsigned int u;

    u = static_cast<unsigned int>(m_context_length_unit_system);
    if (!archive.ReadInt(&u))
      break;
    m_context_length_unit_system = ON::LengthUnitSystemFromUnsigned(u);

    u = static_cast<unsigned int>(m_context_angle_unit_system);
    if (!archive.ReadInt(&u))
      break;
    m_context_angle_unit_system = ON::AngleUnitSystemFromUnsigned(u);

    if (!archive.ReadString(m_scale_as_string))
      break;

    if (!m_left_length.Read(archive))
      break;
    if (!m_right_length.Read(archive))
      break;

    if (content_version >= 1)
    {
      // content version 1 added m_string_format_preference
      u = static_cast<unsigned char>(m_string_format_preference);
      if (!archive.ReadInt(&u))
        break;
      m_string_format_preference = ON_ScaleValue::ScaleStringFormatFromUnsigned(u);
    }

    rc = true;
    break;
  }

  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}